

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

void __thiscall
jaegertracing::Config::Config
          (Config *this,bool disabled,Config *sampler,Config *reporter,HeadersConfig *headers,
          RestrictionsConfig *baggageRestrictions,string *serviceName,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *tags)

{
  RestrictionsConfig *baggageRestrictions_local;
  HeadersConfig *headers_local;
  Config *reporter_local;
  Config *sampler_local;
  bool disabled_local;
  Config *this_local;
  
  this->_disabled = disabled;
  std::__cxx11::string::string((string *)&this->_serviceName,(string *)serviceName);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&this->_tags,tags);
  samplers::Config::Config(&this->_sampler,sampler);
  reporters::Config::Config(&this->_reporter,reporter);
  propagation::HeadersConfig::HeadersConfig(&this->_headers,headers);
  baggage::RestrictionsConfig::RestrictionsConfig(&this->_baggageRestrictions,baggageRestrictions);
  return;
}

Assistant:

explicit Config(bool disabled = false,
                    const samplers::Config& sampler = samplers::Config(),
                    const reporters::Config& reporter = reporters::Config(),
                    const propagation::HeadersConfig& headers =
                        propagation::HeadersConfig(),
                    const baggage::RestrictionsConfig& baggageRestrictions =
                        baggage::RestrictionsConfig(),
                    const std::string& serviceName = "",
                    const std::vector<Tag>&  tags = std::vector<Tag>())
        : _disabled(disabled)
        , _serviceName(serviceName)
        , _tags(tags)
        , _sampler(sampler)
        , _reporter(reporter)
        , _headers(headers)
        , _baggageRestrictions(baggageRestrictions)
    {
    }